

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O0

_Bool trans_VMOV_single(DisasContext_conflict1 *s,arg_VMOV_single *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 pTVar2;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  arg_VMOV_single *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = isar_feature_aa32_fpsp_v2(s->isar);
  if (_Var1) {
    _Var1 = vfp_access_check(s);
    if (_Var1) {
      if (a->l == 0) {
        pTVar2 = load_reg(s,a->rt);
        neon_store_reg32(tcg_ctx_00,pTVar2,a->vn);
        tcg_temp_free_i32(tcg_ctx_00,pTVar2);
      }
      else {
        pTVar2 = tcg_temp_new_i32(tcg_ctx_00);
        neon_load_reg32(tcg_ctx_00,pTVar2,a->vn);
        if (a->rt == 0xf) {
          gen_set_cpsr(tcg_ctx_00,pTVar2,0xf0000000);
          tcg_temp_free_i32(tcg_ctx_00,pTVar2);
        }
        else {
          store_reg(s,a->rt,pTVar2);
        }
      }
      s_local._7_1_ = true;
    }
    else {
      s_local._7_1_ = true;
    }
  }
  else {
    s_local._7_1_ = false;
  }
  return s_local._7_1_;
}

Assistant:

static bool trans_VMOV_single(DisasContext *s, arg_VMOV_single *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    if (!dc_isar_feature(aa32_fpsp_v2, s)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    if (a->l) {
        /* VFP to general purpose register */
        tmp = tcg_temp_new_i32(tcg_ctx);
        neon_load_reg32(tcg_ctx, tmp, a->vn);
        if (a->rt == 15) {
            /* Set the 4 flag bits in the CPSR.  */
            gen_set_nzcv(tmp);
            tcg_temp_free_i32(tcg_ctx, tmp);
        } else {
            store_reg(s, a->rt, tmp);
        }
    } else {
        /* general purpose register to VFP */
        tmp = load_reg(s, a->rt);
        neon_store_reg32(tcg_ctx, tmp, a->vn);
        tcg_temp_free_i32(tcg_ctx, tmp);
    }

    return true;
}